

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

void __thiscall HullLibrary::removeb2b(HullLibrary *this,cbtHullTriangle *s,cbtHullTriangle *t)

{
  b2bfix(this,s,t);
  deAllocateTriangle(this,s);
  deAllocateTriangle(this,t);
  return;
}

Assistant:

void HullLibrary::removeb2b(cbtHullTriangle *s, cbtHullTriangle *t)
{
	b2bfix(s, t);
	deAllocateTriangle(s);

	deAllocateTriangle(t);
}